

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O0

AbstractSearchState * __thiscall CIntHeap::deleteminheap(CIntHeap *this)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  CIntHeap *in_RDI;
  heapintelement tmp;
  AbstractSearchState *AbstractSearchState;
  char *in_stack_fffffffffffffff0;
  AbstractSearchState *pAVar4;
  
  if (in_RDI->currentsize == 0) {
    heaperror(in_stack_fffffffffffffff0);
  }
  pAVar4 = in_RDI->heap[1].heapstate;
  pAVar4->heapindex = 0;
  iVar1 = in_RDI->currentsize;
  in_RDI->currentsize = iVar1 + -1;
  uVar2 = in_RDI->heap[iVar1].heapstate;
  uVar3 = in_RDI->heap[iVar1].key;
  tmp.key = uVar3;
  tmp.heapstate = (AbstractSearchState *)uVar2;
  tmp._12_4_ = 0;
  percolatedown(in_RDI,1,tmp);
  return pAVar4;
}

Assistant:

AbstractSearchState* CIntHeap::deleteminheap()
{
    AbstractSearchState *AbstractSearchState;

    if (currentsize == 0) heaperror("DeleteMin: heap is empty");

    AbstractSearchState = heap[1].heapstate;
    AbstractSearchState->heapindex = 0;
    percolatedown(1, heap[currentsize--]);
    return AbstractSearchState;
}